

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode resolver_error(connectdata *conn)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = ((conn->bits).field_0x4 & 0x40) == 0;
  pcVar1 = "proxy";
  if (bVar2) {
    pcVar1 = "host";
  }
  Curl_failf(conn->data,"Could not resolve %s: %s",pcVar1,(conn->async).hostname);
  return bVar2 + CURLE_COULDNT_RESOLVE_PROXY;
}

Assistant:

static CURLcode resolver_error(struct connectdata *conn)
{
  const char *host_or_proxy;
  CURLcode result;

  if(conn->bits.httpproxy) {
    host_or_proxy = "proxy";
    result = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    host_or_proxy = "host";
    result = CURLE_COULDNT_RESOLVE_HOST;
  }

  failf(conn->data, "Could not resolve %s: %s", host_or_proxy,
        conn->async.hostname);

  return result;
}